

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O2

void __thiscall
sc_core::sc_trace_file_base::set_time_unit(sc_trace_file_base *this,double v,sc_time_unit tu)

{
  ostream *poVar1;
  value_type vVar2;
  ulong uVar3;
  unit_type tu_00;
  string local_1b8;
  double local_198;
  stringstream ss;
  ostream local_180 [376];
  
  if (this->initialized_ == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_180,(string *)&this->filename_);
    std::operator<<(poVar1,
                    "\n\tTimescale unit cannot be changed once tracing has begun.\n\tTo change the scale, create a new trace file."
                   );
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_ERROR,"sc_trace_file already initialized",local_1b8._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,0xd3);
    std::__cxx11::string::_M_dispose();
  }
  else {
    this->timescale_set_by_user = true;
    local_198 = v;
    vVar2 = unit_to_fs(tu);
    uVar3 = (ulong)((double)(long)vVar2 * local_198);
    this->trace_unit_fs =
         (long)((double)(long)vVar2 * local_198 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
         uVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    fs_unit_to_str_abi_cxx11_(&local_1b8,(sc_trace_file_base *)this->trace_unit_fs,tu_00);
    poVar1 = std::operator<<(local_180,(string *)&local_1b8);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = std::operator<<(poVar1,(string *)&this->filename_);
    std::operator<<(poVar1,")");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_INFO,"tracing timescale unit set",local_1b8._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,0xdf);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void
sc_trace_file_base::set_time_unit( double v, sc_time_unit tu )
{
    if( initialized_ )
    {
        std::stringstream ss;
        ss << filename_ << "\n"
           "\tTimescale unit cannot be changed once tracing has begun.\n"
           "\tTo change the scale, create a new trace file.";
        SC_REPORT_ERROR( SC_ID_TRACING_ALREADY_INITIALIZED_
                       , ss.str().c_str() );
        return;
    }

    timescale_set_by_user = true;
    trace_unit_fs = static_cast<unit_type>(v * unit_to_fs(tu));

    // EMIT ADVISORY MESSAGE ABOUT CHANGE IN TIME SCALE:
    {
      std::stringstream ss;
      ss << fs_unit_to_str(trace_unit_fs)
         << " (" << filename_ << ")";
      SC_REPORT_INFO( SC_ID_TRACING_TIMESCALE_UNIT_, ss.str().c_str() );
    }
}